

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void __thiscall kratos::DebugDatabase::set_break_points(DebugDatabase *this,Generator *top)

{
  allocator<char> local_39;
  string local_38;
  Generator *local_18;
  Generator *top_local;
  DebugDatabase *this_local;
  
  local_18 = top;
  top_local = (Generator *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,".py",&local_39);
  set_break_points(this,top,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void DebugDatabase::set_break_points(Generator *top) { set_break_points(top, ".py"); }